

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

Binding __thiscall
Lib::
BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
::pop(BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
      *this)

{
  ulong uVar1;
  TermList TVar2;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  *in_RDI;
  Binding BVar3;
  Binding res;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  *this_00;
  
  uVar1 = *(ulong *)in_RDI->_data;
  TVar2._content = (in_RDI->_data->term)._content;
  in_RDI->_size = in_RDI->_size - 1;
  if (in_RDI->_size != 0) {
    this_00 = in_RDI;
    std::swap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding>
              (in_RDI->_data,in_RDI->_data + in_RDI->_size);
    bubbleDown(this_00,(uint)((ulong)in_RDI >> 0x20));
  }
  BVar3._0_8_ = uVar1 & 0xffffffff;
  BVar3.term._content = TVar2._content;
  return BVar3;
}

Assistant:

inline
  T pop()
  {
    ASS(!isEmpty());
    T res=_data[0];
    _size--;
    if(_size) {
      std::swap(_data[0],_data[_size]);
      bubbleDown(1);
    }
    _data[_size].~T();
    return res;
  }